

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

char * leveldb::EncodeVarint32(char *dst,uint32_t v)

{
  long lVar1;
  byte bVar2;
  uint in_ESI;
  byte *in_RDI;
  long in_FS_OFFSET;
  uint8_t *ptr;
  byte *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = (byte)in_ESI;
  if (in_ESI < 0x80) {
    local_20 = in_RDI + 1;
    *in_RDI = bVar2;
  }
  else if (in_ESI < 0x4000) {
    *in_RDI = bVar2 | 0x80;
    local_20 = in_RDI + 2;
    in_RDI[1] = (byte)(in_ESI >> 7);
  }
  else if (in_ESI < 0x200000) {
    *in_RDI = bVar2 | 0x80;
    in_RDI[1] = (byte)(in_ESI >> 7) | 0x80;
    local_20 = in_RDI + 3;
    in_RDI[2] = (byte)(in_ESI >> 0xe);
  }
  else if (in_ESI < 0x10000000) {
    *in_RDI = bVar2 | 0x80;
    in_RDI[1] = (byte)(in_ESI >> 7) | 0x80;
    in_RDI[2] = (byte)(in_ESI >> 0xe) | 0x80;
    local_20 = in_RDI + 4;
    in_RDI[3] = (byte)(in_ESI >> 0x15);
  }
  else {
    *in_RDI = bVar2 | 0x80;
    in_RDI[1] = (byte)(in_ESI >> 7) | 0x80;
    in_RDI[2] = (byte)(in_ESI >> 0xe) | 0x80;
    in_RDI[3] = (byte)(in_ESI >> 0x15) | 0x80;
    local_20 = in_RDI + 5;
    in_RDI[4] = (byte)(in_ESI >> 0x1c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (char *)local_20;
}

Assistant:

char* EncodeVarint32(char* dst, uint32_t v) {
  // Operate on characters as unsigneds
  uint8_t* ptr = reinterpret_cast<uint8_t*>(dst);
  static const int B = 128;
  if (v < (1 << 7)) {
    *(ptr++) = v;
  } else if (v < (1 << 14)) {
    *(ptr++) = v | B;
    *(ptr++) = v >> 7;
  } else if (v < (1 << 21)) {
    *(ptr++) = v | B;
    *(ptr++) = (v >> 7) | B;
    *(ptr++) = v >> 14;
  } else if (v < (1 << 28)) {
    *(ptr++) = v | B;
    *(ptr++) = (v >> 7) | B;
    *(ptr++) = (v >> 14) | B;
    *(ptr++) = v >> 21;
  } else {
    *(ptr++) = v | B;
    *(ptr++) = (v >> 7) | B;
    *(ptr++) = (v >> 14) | B;
    *(ptr++) = (v >> 21) | B;
    *(ptr++) = v >> 28;
  }
  return reinterpret_cast<char*>(ptr);
}